

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::VerifyFinalize(Recycler *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  undefined8 *in_FS_OFFSET;
  
  if (((this->collectionState).value & CollectionStateMark) != CollectionStateNotCollecting) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x2445,"(!this->IsMarkState())","!this->IsMarkState()");
    if (!bVar3) goto LAB_0026fb1b;
    *puVar1 = 0;
  }
  sVar4 = HeapInfoManager::GetFinalizeCount(&this->autoHeap);
  if (sVar4 != (this->collectionStats).finalizeCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x2449,
                       "(currentFinalizableObjectCount == this->collectionStats.finalizeCount)",
                       "currentFinalizableObjectCount == this->collectionStats.finalizeCount");
    if (!bVar3) {
LAB_0026fb1b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  return;
}

Assistant:

void
Recycler::VerifyFinalize()
{
    // We can't check this if we are marking
    Assert(!this->IsMarkState());

    size_t currentFinalizableObjectCount = this->autoHeap.GetFinalizeCount();
#if DBG
    Assert(currentFinalizableObjectCount == this->collectionStats.finalizeCount);
#else
    if (currentFinalizableObjectCount != >this->collectionStats.finalizeCount)
    {
        Output::Print(_u("ERROR: Recycler dropped some finalizable objects"));
        DebugBreak();
    }
#endif
}